

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintgb.h
# Opt level: O1

void __thiscall
FastPForLib::VarIntGB<false>::encodeArray
          (VarIntGB<false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  
  *out = (uint32_t)length;
  puVar4 = out + 1;
  if (length < 4) {
    uVar3 = 0;
  }
  else {
    uVar2 = 3;
    do {
      uVar3 = uVar2;
      *(byte *)puVar4 = 0;
      uVar6 = in[uVar3 - 3];
      if (uVar6 < 0x100) {
        puVar5 = (uint *)((long)puVar4 + 2);
        *(byte *)((long)puVar4 + 1) = (byte)uVar6;
      }
      else if (uVar6 < 0x10000) {
        puVar5 = (uint *)((long)puVar4 + 3);
        *(short *)((long)puVar4 + 1) = (short)uVar6;
        *(byte *)puVar4 = 1;
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)((long)puVar4 + 1) = (byte)uVar6;
        *(byte *)((long)puVar4 + 2) = (byte)(uVar6 >> 8);
        puVar5 = puVar4 + 1;
        *(byte *)((long)puVar4 + 3) = (byte)(uVar6 >> 0x10);
        *(byte *)puVar4 = 2;
      }
      else {
        *(uint *)((long)puVar4 + 1) = uVar6;
        puVar5 = (uint *)((long)puVar4 + 5);
        *(byte *)puVar4 = 3;
      }
      uVar6 = in[uVar3 - 2];
      if (uVar6 < 0x100) {
        *(byte *)puVar5 = (byte)uVar6;
        puVar5 = (uint *)((long)puVar5 + 1);
      }
      else if (uVar6 < 0x10000) {
        *(short *)puVar5 = (short)uVar6;
        puVar5 = (uint *)((long)puVar5 + 2);
        *(byte *)puVar4 = (byte)*puVar4 | 4;
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)puVar5 = (byte)uVar6;
        *(byte *)((long)puVar5 + 1) = (byte)(uVar6 >> 8);
        *(byte *)((long)puVar5 + 2) = (byte)(uVar6 >> 0x10);
        puVar5 = (uint *)((long)puVar5 + 3);
        *(byte *)puVar4 = (byte)*puVar4 | 8;
      }
      else {
        *puVar5 = uVar6;
        puVar5 = puVar5 + 1;
        *(byte *)puVar4 = (byte)*puVar4 | 0xc;
      }
      uVar6 = in[uVar3 - 1];
      if (uVar6 < 0x100) {
        *(byte *)puVar5 = (byte)uVar6;
        puVar5 = (uint *)((long)puVar5 + 1);
      }
      else if (uVar6 < 0x10000) {
        *(short *)puVar5 = (short)uVar6;
        puVar5 = (uint *)((long)puVar5 + 2);
        *(byte *)puVar4 = (byte)*puVar4 | 0x10;
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)puVar5 = (byte)uVar6;
        *(byte *)((long)puVar5 + 1) = (byte)(uVar6 >> 8);
        *(byte *)((long)puVar5 + 2) = (byte)(uVar6 >> 0x10);
        puVar5 = (uint *)((long)puVar5 + 3);
        *(byte *)puVar4 = (byte)*puVar4 | 0x20;
      }
      else {
        *puVar5 = uVar6;
        puVar5 = puVar5 + 1;
        *(byte *)puVar4 = (byte)*puVar4 | 0x30;
      }
      uVar6 = in[uVar3];
      if (uVar6 < 0x100) {
        *(byte *)puVar5 = (byte)uVar6;
        puVar4 = (uint *)((long)puVar5 + 1);
      }
      else if (uVar6 < 0x10000) {
        *(short *)puVar5 = (short)uVar6;
        *(byte *)puVar4 = (byte)*puVar4 | 0x40;
        puVar4 = (uint *)((long)puVar5 + 2);
      }
      else if (uVar6 < 0x1000000) {
        *(byte *)puVar5 = (byte)uVar6;
        *(byte *)((long)puVar5 + 1) = (byte)(uVar6 >> 8);
        *(byte *)((long)puVar5 + 2) = (byte)(uVar6 >> 0x10);
        *(byte *)puVar4 = (byte)*puVar4 | 0x80;
        puVar4 = (uint *)((long)puVar5 + 3);
      }
      else {
        *puVar5 = uVar6;
        *(byte *)puVar4 = (byte)*puVar4 | 0xc0;
        puVar4 = puVar5 + 1;
      }
      uVar2 = uVar3 + 4;
    } while (uVar3 + 4 < length);
    uVar3 = uVar3 + 1;
  }
  puVar5 = puVar4;
  if (uVar3 < length) {
    puVar5 = (uint *)((long)puVar4 + 1);
    *(byte *)puVar4 = 0;
    uVar6 = 0;
    do {
      uVar1 = in[uVar3];
      if (uVar1 < 0x100) {
        *(byte *)puVar5 = (byte)uVar1;
        puVar5 = (uint *)((long)puVar5 + 1);
      }
      else {
        if (uVar1 < 0x10000) {
          *(short *)puVar5 = (short)uVar1;
          puVar5 = (uint *)((long)puVar5 + 2);
          bVar7 = (byte)(1 << (uVar6 & 0x1f));
        }
        else if (uVar1 < 0x1000000) {
          *(byte *)puVar5 = (byte)uVar1;
          *(byte *)((long)puVar5 + 1) = (byte)(uVar1 >> 8);
          *(byte *)((long)puVar5 + 2) = (byte)(uVar1 >> 0x10);
          puVar5 = (uint *)((long)puVar5 + 3);
          bVar7 = (byte)(2 << (uVar6 & 0x1f));
        }
        else {
          *puVar5 = uVar1;
          puVar5 = puVar5 + 1;
          bVar7 = (byte)(3 << (uVar6 & 0x1f));
        }
        *(byte *)puVar4 = (byte)*puVar4 | bVar7;
      }
    } while ((uVar3 + 1 < length) &&
            (bVar8 = uVar6 < 6, uVar3 = uVar3 + 1, uVar6 = uVar6 + 2, bVar8));
  }
  if (((ulong)puVar5 & 3) != 0) {
    uVar3 = (ulong)((uint)puVar5 & 3);
    memset(puVar5,0,4 - uVar3);
    puVar5 = (uint *)((uVar3 ^ 3) + 1 + (long)puVar5);
  }
  *nvalue = (ulong)((long)puVar5 - (long)out) >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    uint32_t prev = 0; // for delta

    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    *out = static_cast<uint32_t>(length);
    bout += 4;

    size_t k = 0;
    for (; k + 3 < length; k += 4) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp = static_cast<uint8_t>(1);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp = static_cast<uint8_t>(2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp = static_cast<uint8_t>(3);
        }
      }
      {
        const uint32_t val = delta ? in[k + 1] - prev : in[k + 1];
        if (delta)
          prev = in[k + 1];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 2);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 2);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 2);
        }
      }
      {
        const uint32_t val = delta ? in[k + 2] - prev : in[k + 2];
        if (delta)
          prev = in[k + 2];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 4);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 4);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 4);
        }
      }
      {
        const uint32_t val = delta ? in[k + 3] - prev : in[k + 3];
        if (delta)
          prev = in[k + 3];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << 6);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << 6);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << 6);
        }
      }
    }

    if (k < length) {
      uint8_t *keyp = bout++;
      *keyp = 0;
      for (int j = 0; k < length && j < 8; j += 2, ++k) {
        const uint32_t val = delta ? in[k] - prev : in[k];
        if (delta)
          prev = in[k];
        if (val < (1U << 8)) {
          *bout++ = static_cast<uint8_t>(val);
        } else if (val < (1U << 16)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *keyp |= static_cast<uint8_t>(1 << j);
        } else if (val < (1U << 24)) {
          *bout++ = static_cast<uint8_t>(val);
          *bout++ = static_cast<uint8_t>(val >> 8);
          *bout++ = static_cast<uint8_t>(val >> 16);
          *keyp |= static_cast<uint8_t>(2 << j);
        } else {
          // the compiler will do the right thing
          *reinterpret_cast<uint32_t *>(bout) = val;
          bout += 4;
          *keyp |= static_cast<uint8_t>(3 << j);
        }
      }
    }
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0;
    }
    const size_t storageinbytes = bout - initbout;
    assert((storageinbytes % 4) == 0);
    nvalue = storageinbytes / 4;
  }